

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O3

void __thiscall duckdb::roaring::RoaringAnalyzeState::FlushContainer(RoaringAnalyzeState *this)

{
  pointer *ppCVar1;
  ushort count;
  BlockManager *pBVar2;
  iterator __position;
  ContainerMetadata metadata_00;
  uint uVar3;
  idx_t iVar4;
  idx_t iVar5;
  ContainerType CVar6;
  ContainerMetadataCollection *this_00;
  ulong uVar7;
  ContainerMetadata metadata;
  ContainerMetadata local_2c;
  
  count = this->count;
  if (count != 0) {
    this_00 = (ContainerMetadataCollection *)(ulong)count;
    metadata_00 = ContainerMetadata::CreateMetadata
                            (count,this->zero_count,this->one_count,this->run_count);
    CVar6 = metadata_00.container_type;
    iVar4 = (ulong)(CVar6 != RUN_CONTAINER) + (this->metadata_collection).arrays_in_segment;
    iVar5 = (ulong)(CVar6 == RUN_CONTAINER) + (this->metadata_collection).runs_in_segment;
    local_2c = metadata_00;
    iVar4 = ContainerMetadataCollection::GetMetadataSize(this_00,iVar5 + iVar4,iVar5,iVar4);
    uVar3 = (uint)metadata_00 >> 0x10;
    this->metadata_size = iVar4;
    if (CVar6 == RUN_CONTAINER) {
      uVar7 = (ulong)(uVar3 * 4);
      if (0x3ffff < (uint)metadata_00) {
        uVar7 = (ulong)uVar3 * 2 + 8;
      }
    }
    else if (((uint)metadata_00 & 0xff) == 2) {
      uVar7 = (ulong)(this->count >> 3 & 0xfffffff8);
    }
    else {
      uVar7 = (ulong)(uVar3 * 2);
      if (0x7ffff < (uint)metadata_00) {
        uVar7 = (ulong)uVar3 + 8;
      }
    }
    iVar5 = uVar7 + this->data_size;
    this->data_size = iVar5;
    uVar7 = iVar5 + iVar4;
    pBVar2 = (this->super_AnalyzeState).info.block_manager;
    iVar4 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
    iVar5 = optional_idx::GetIndex(&pBVar2->block_header_size);
    if ((iVar4 - (iVar5 + uVar7) < uVar7) && (this->current_count != 0)) {
      iVar4 = this->metadata_size;
      iVar5 = this->data_size;
      (this->metadata_collection).count_in_segment = 0;
      (this->metadata_collection).runs_in_segment = 0;
      (this->metadata_collection).arrays_in_segment = 0;
      this->total_size = this->total_size + iVar4 + iVar5;
      this->current_count = 0;
      this->data_size = 0;
      this->metadata_size = 0;
      this->segment_count = this->segment_count + 1;
    }
    __position._M_current =
         (this->container_metadata).
         super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
         .
         super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->container_metadata).
        super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
        .
        super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<duckdb::roaring::ContainerMetadata,std::allocator<duckdb::roaring::ContainerMetadata>>
      ::_M_realloc_insert<duckdb::roaring::ContainerMetadata_const&>
                ((vector<duckdb::roaring::ContainerMetadata,std::allocator<duckdb::roaring::ContainerMetadata>>
                  *)&this->container_metadata,__position,&local_2c);
      metadata_00 = local_2c;
    }
    else {
      *__position._M_current = metadata_00;
      ppCVar1 = &(this->container_metadata).
                 super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
                 .
                 super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar1 = *ppCVar1 + 1;
    }
    ContainerMetadataCollection::AddMetadata(&this->metadata_collection,metadata_00);
    this->current_count = this->current_count + (ulong)this->count;
    this->count = 0;
    *(undefined4 *)((long)&this->zero_count + 1) = 0;
    this->one_count = 0;
    this->zero_count = 0;
  }
  return;
}

Assistant:

void RoaringAnalyzeState::FlushContainer() {
	if (!count) {
		return;
	}
	auto metadata = GetResult();
	idx_t runs_count = metadata_collection.GetRunContainerCount();
	idx_t arrays_count = metadata_collection.GetArrayAndBitsetContainerCount();

	if (metadata.IsRun()) {
		runs_count++;
	} else {
		arrays_count++;
	}

	metadata_size = metadata_collection.GetMetadataSize(runs_count + arrays_count, runs_count, arrays_count);

	data_size += metadata.GetDataSizeInBytes(count);
	if (!HasEnoughSpaceInSegment(metadata_size + data_size)) {
		FlushSegment();
	}
	container_metadata.push_back(metadata);
	metadata_collection.AddMetadata(metadata);
	current_count += count;

	// Reset the container analyze state
	one_count = 0;
	zero_count = 0;
	run_count = 0;
	last_bit_set = false;
	count = 0;
}